

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result __thiscall wabt::interp::Table::Grow(Table *this,Store *store,u32 count,Ref ref)

{
  bool bVar1;
  uint local_3c;
  size_type sStack_38;
  u32 new_size;
  size_t old_size;
  Store *pSStack_28;
  u32 count_local;
  Store *store_local;
  Table *this_local;
  Ref ref_local;
  
  old_size._4_4_ = count;
  pSStack_28 = store;
  store_local = (Store *)this;
  this_local = (Table *)ref.index;
  sStack_38 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::size
                        (&this->elements_);
  bVar1 = Store::HasValueType(pSStack_28,(Ref)this_local,
                              *(ValueType *)&(this->type_).super_ExternType.field_0xc);
  if (!bVar1) {
    __assert_fail("store.HasValueType(ref, type_.element)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                  ,0x209,"Result wabt::interp::Table::Grow(Store &, u32, Ref)");
  }
  bVar1 = CanGrow<unsigned_int>(&(this->type_).limits,(uint)sStack_38,old_size._4_4_,&local_3c);
  if (bVar1) {
    (this->type_).limits.initial = (ulong)old_size._4_4_ + (this->type_).limits.initial;
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::resize
              (&this->elements_,(ulong)local_3c);
    Fill(this,pSStack_28,(u32)sStack_38,(Ref)this_local,local_3c - (u32)sStack_38);
    Result::Result((Result *)((long)&ref_local.index + 4),Ok);
  }
  else {
    Result::Result((Result *)((long)&ref_local.index + 4),Error);
  }
  return (Result)ref_local.index._4_4_;
}

Assistant:

Result Table::Grow(Store& store, u32 count, Ref ref) {
  size_t old_size = elements_.size();
  u32 new_size;
  assert(store.HasValueType(ref, type_.element));
  if (CanGrow<u32>(type_.limits, old_size, count, &new_size)) {
    // Grow the limits of the table too, so that if it is used as an
    // import to another module its new size is honored.
    type_.limits.initial += count;
    elements_.resize(new_size);
    Fill(store, old_size, ref, new_size - old_size);
    return Result::Ok;
  }
  return Result::Error;
}